

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc-attack-detector.c
# Opt level: O2

_Bool detect_attack(crcda_ctx *ctx,uchar *buf,uint32_t len,uchar *IV)

{
  ushort uVar1;
  long lVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint16_t *puVar5;
  long *plVar6;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  uint16_t uVar10;
  
  if ((0x40000 < len) || ((len & 7) != 0)) {
    __assert_fail("!(len > (SSH_MAXBLOCKS * SSH_BLOCKSIZE) || len % SSH_BLOCKSIZE != 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/crc-attack-detector.c"
                  ,0x70,
                  "_Bool detect_attack(struct crcda_ctx *, const unsigned char *, uint32_t, const unsigned char *)"
                 );
  }
  uVar7 = ctx->n;
  do {
    uVar8 = uVar7;
    uVar7 = uVar8 * 4;
  } while (uVar8 < (len >> 4) + (len >> 3));
  puVar5 = ctx->h;
  if (puVar5 == (uint16_t *)0x0) {
    ctx->n = uVar8;
    puVar5 = (uint16_t *)safemalloc((ulong)uVar8,2,0);
  }
  else {
    if (uVar8 <= ctx->n) goto LAB_0011e2c3;
    ctx->n = uVar8;
    puVar5 = (uint16_t *)saferealloc(puVar5,(ulong)uVar8,2);
  }
  ctx->h = puVar5;
LAB_0011e2c3:
  if (len < 0x39) {
    plVar9 = (long *)buf;
    do {
      if (buf + len <= plVar9) {
        return false;
      }
      plVar6 = (long *)buf;
      if ((IV != (uchar *)0x0) && (*plVar9 == *(long *)IV)) {
        _Var3 = check_crc((uint8_t *)plVar9,buf,len,IV);
        if (!_Var3) {
          return false;
        }
        return true;
      }
      do {
        if (plVar9 <= plVar6) goto LAB_0011e321;
        lVar2 = *plVar6;
        plVar6 = plVar6 + 1;
      } while (*plVar9 != lVar2);
      _Var3 = check_crc((uint8_t *)plVar9,buf,len,IV);
      if (_Var3) {
        return true;
      }
LAB_0011e321:
      plVar9 = plVar9 + 1;
    } while( true );
  }
  memset(puVar5,0xff,(ulong)ctx->n * 2);
  if (IV != (uchar *)0x0) {
    puVar5 = ctx->h;
    uVar4 = GET_32BIT_MSB_FIRST(IV);
    puVar5[ctx->n - 1 & uVar4] = 0xfffe;
  }
  uVar10 = 0;
  plVar9 = (long *)buf;
LAB_0011e376:
  if (plVar9 >= buf + len) {
    return false;
  }
  uVar4 = GET_32BIT_MSB_FIRST(plVar9);
  do {
    uVar7 = uVar4 & ctx->n - 1;
    uVar1 = ctx->h[uVar7];
    if (uVar1 == 0xfffe) {
      if (IV == (uchar *)0x0) {
        __assert_fail("IV",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/crc-attack-detector.c"
                      ,0x9a,
                      "_Bool detect_attack(struct crcda_ctx *, const unsigned char *, uint32_t, const unsigned char *)"
                     );
      }
      if (*plVar9 == *(long *)IV) break;
    }
    else {
      if (uVar1 == 0xffff) goto LAB_0011e3e9;
      if (*plVar9 == *(long *)(buf + (ulong)uVar1 * 8)) break;
    }
    uVar4 = uVar7 + 1;
  } while( true );
  _Var3 = check_crc((uint8_t *)plVar9,buf,len,IV);
  if (_Var3) {
    return plVar9 < buf + len;
  }
LAB_0011e3e9:
  ctx->h[uVar7] = uVar10;
  plVar9 = plVar9 + 1;
  uVar10 = uVar10 + 1;
  goto LAB_0011e376;
}

Assistant:

bool detect_attack(struct crcda_ctx *ctx,
                   const unsigned char *buf, uint32_t len,
                   const unsigned char *IV)
{
    register uint32_t i, j;
    uint32_t l;
    register const uint8_t *c;
    const uint8_t *d;

    assert(!(len > (SSH_MAXBLOCKS * SSH_BLOCKSIZE) ||
             len % SSH_BLOCKSIZE != 0));
    for (l = ctx->n; l < HASH_FACTOR(len / SSH_BLOCKSIZE); l = l << 2)
        ;

    if (ctx->h == NULL) {
        ctx->n = l;
        ctx->h = snewn(ctx->n, uint16_t);
    } else {
        if (l > ctx->n) {
            ctx->n = l;
            ctx->h = sresize(ctx->h, ctx->n, uint16_t);
        }
    }

    if (len <= HASH_MINBLOCKS) {
        for (c = buf; c < buf + len; c += SSH_BLOCKSIZE) {
            if (IV && (!CMP(c, IV))) {
                if ((check_crc(c, buf, len, IV)))
                    return true;          /* attack detected */
                else
                    break;
            }
            for (d = buf; d < c; d += SSH_BLOCKSIZE) {
                if (!CMP(c, d)) {
                    if ((check_crc(c, buf, len, IV)))
                        return true;      /* attack detected */
                    else
                        break;
                }
            }
        }
        return false;                  /* ok */
    }
    memset(ctx->h, HASH_UNUSEDCHAR, ctx->n * HASH_ENTRYSIZE);

    if (IV)
        ctx->h[HASH(IV) & (ctx->n - 1)] = HASH_IV;

    for (c = buf, j = 0; c < (buf + len); c += SSH_BLOCKSIZE, j++) {
        for (i = HASH(c) & (ctx->n - 1); ctx->h[i] != HASH_UNUSED;
             i = (i + 1) & (ctx->n - 1)) {
            if (ctx->h[i] == HASH_IV) {
                assert(IV); /* or we wouldn't have stored HASH_IV above */
                if (!CMP(c, IV)) {
                    if (check_crc(c, buf, len, IV))
                        return true;      /* attack detected */
                    else
                        break;
                }
            } else if (!CMP(c, buf + ctx->h[i] * SSH_BLOCKSIZE)) {
                if (check_crc(c, buf, len, IV))
                    return true;          /* attack detected */
                else
                    break;
            }
        }
        ctx->h[i] = j;
    }
    return false;                          /* ok */
}